

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O2

Lpk_Man_t * Lpk_ManStart(Lpk_Par_t *pPars)

{
  uint uVar1;
  undefined4 uVar2;
  void *pvVar3;
  Lpk_Man_t *pLVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *pVVar6;
  Kit_DsdMan_t *pKVar7;
  uint *puVar8;
  byte bVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  char *__assertion;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  
  if (pPars->nLutsMax < 0x11) {
    uVar1 = pPars->nVarsMax;
    if (uVar1 - 1 < 0x10) {
      pLVar4 = (Lpk_Man_t *)calloc(1,0x7dc358);
      pLVar4->pPars = pPars;
      iVar15 = 1;
      pLVar4->nCutsMax = 10000;
      uVar14 = (ulong)(uint)(1 << ((char)uVar1 - 5U & 0x1f));
      if (uVar1 < 6) {
        uVar14 = 1;
      }
      pVVar5 = Vec_PtrAllocSimInfo(uVar1,(int)uVar14);
      for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
        pvVar3 = pVVar5->pArray[uVar10];
        if (uVar10 < 5) {
          uVar2 = (&DAT_00808d10)[uVar10];
          for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
            *(undefined4 *)((long)pvVar3 + uVar13 * 4) = uVar2;
          }
        }
        else {
          for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
            *(uint *)((long)pvVar3 + uVar13 * 4) =
                 -(uint)((1 << ((char)uVar10 - 5U & 0x1f) & (uint)uVar13) != 0);
          }
        }
      }
      pLVar4->vTtElems = pVVar5;
      iVar12 = 1 << ((char)pPars->nVarsMax - 5U & 0x1f);
      if (pPars->nVarsMax < 6) {
        iVar12 = iVar15;
      }
      pVVar5 = Vec_PtrAllocSimInfo(0x400,iVar12);
      pLVar4->vTtNodes = pVVar5;
      iVar12 = 0x1000;
      pVVar6 = Vec_IntAlloc(0x1000);
      pLVar4->vCover = pVVar6;
      pVVar5 = Vec_PtrAlloc(iVar12);
      pLVar4->vLeaves = pVVar5;
      pVVar5 = Vec_PtrAlloc(iVar12);
      pLVar4->vTemp = pVVar5;
      for (lVar16 = 0xfb846; lVar16 != 0xfb84e; lVar16 = lVar16 + 1) {
        pVVar6 = Vec_IntAlloc(100);
        *(Vec_Int_t **)(pLVar4->pCuts[0].uSign + lVar16 * 2 + -0xb) = pVVar6;
      }
      pKVar7 = Kit_DsdManAlloc(pPars->nVarsMax,0x40);
      pLVar4->pDsdMan = pKVar7;
      pVVar6 = Vec_IntAlloc(0x8000);
      pLVar4->vMemory = pVVar6;
      pVVar6 = Vec_IntAlloc(0x100);
      pLVar4->vBddDir = pVVar6;
      pVVar6 = Vec_IntAlloc(0x100);
      pLVar4->vBddInv = pVVar6;
      bVar9 = (char)pPars->nVarsMax - 5;
      bVar11 = 0;
      if (5 < pPars->nVarsMax) {
        bVar11 = bVar9;
        iVar15 = 1 << (bVar9 & 0x1f);
      }
      puVar8 = (uint *)malloc((long)(iVar15 << 5) << 2);
      pLVar4->ppTruths[0][0] = puVar8;
      puVar8 = puVar8 + iVar15;
      pLVar4->ppTruths[1][0] = puVar8;
      pLVar4->ppTruths[1][1] = puVar8 + iVar15;
      puVar8 = puVar8 + iVar15 * 2;
      pLVar4->ppTruths[2][0] = puVar8;
      for (lVar16 = 0xfb817; lVar16 != 0xfb81a; lVar16 = lVar16 + 1) {
        *(uint **)(pLVar4->pCuts[0].uSign + lVar16 * 2 + -0xb) =
             puVar8 + ((int)lVar16 + -0xfb816 << (bVar11 & 0x1f));
      }
      puVar8 = puVar8 + iVar15 * 4;
      pLVar4->ppTruths[3][0] = puVar8;
      for (lVar16 = 0xfb827; lVar16 != 0xfb82e; lVar16 = lVar16 + 1) {
        *(uint **)(pLVar4->pCuts[0].uSign + lVar16 * 2 + -0xb) =
             puVar8 + ((int)lVar16 + -0xfb826 << (bVar11 & 0x1f));
      }
      pLVar4->ppTruths[4][0] = puVar8 + (iVar15 << 3);
      for (lVar16 = 0xfb837; lVar16 != 0xfb846; lVar16 = lVar16 + 1) {
        *(uint **)(pLVar4->pCuts[0].uSign + lVar16 * 2 + -0xb) =
             puVar8 + (iVar15 << 3) + ((int)lVar16 + -0xfb836 << (bVar11 & 0x1f));
      }
      return pLVar4;
    }
    __assertion = "pPars->nVarsMax > 0 && pPars->nVarsMax <= 16";
    uVar1 = 0x32;
  }
  else {
    __assertion = "pPars->nLutsMax <= 16";
    uVar1 = 0x31;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkMan.c"
                ,uVar1,"Lpk_Man_t *Lpk_ManStart(Lpk_Par_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Man_t * Lpk_ManStart( Lpk_Par_t * pPars )
{
    Lpk_Man_t * p;
    int i, nWords;
    assert( pPars->nLutsMax <= 16 );
    assert( pPars->nVarsMax > 0 && pPars->nVarsMax <= 16 );
    p = ABC_ALLOC( Lpk_Man_t, 1 );
    memset( p, 0, sizeof(Lpk_Man_t) );
    p->pPars = pPars;
    p->nCutsMax = LPK_CUTS_MAX;
    p->vTtElems = Vec_PtrAllocTruthTables( pPars->nVarsMax );
    p->vTtNodes = Vec_PtrAllocSimInfo( 1024, Abc_TruthWordNum(pPars->nVarsMax) );
    p->vCover   = Vec_IntAlloc( 1 << 12 );
    p->vLeaves  = Vec_PtrAlloc( 32 );
    p->vTemp    = Vec_PtrAlloc( 32 );
    for ( i = 0; i < 8; i++ )
        p->vSets[i] = Vec_IntAlloc(100);
    p->pDsdMan = Kit_DsdManAlloc( pPars->nVarsMax, 64 );
    p->vMemory = Vec_IntAlloc( 1024 * 32 );
    p->vBddDir = Vec_IntAlloc( 256 );
    p->vBddInv = Vec_IntAlloc( 256 );
    // allocate temporary storage for truth tables
    nWords = Kit_TruthWordNum(pPars->nVarsMax);
    p->ppTruths[0][0] = ABC_ALLOC( unsigned, 32 * nWords );
    p->ppTruths[1][0] = p->ppTruths[0][0] + 1 * nWords;
    for ( i = 1; i < 2; i++ )
        p->ppTruths[1][i] = p->ppTruths[1][0] + i * nWords;
    p->ppTruths[2][0] = p->ppTruths[1][0] + 2 * nWords;
    for ( i = 1; i < 4; i++ )
        p->ppTruths[2][i] = p->ppTruths[2][0] + i * nWords;
    p->ppTruths[3][0] = p->ppTruths[2][0] + 4 * nWords; 
    for ( i = 1; i < 8; i++ )
        p->ppTruths[3][i] = p->ppTruths[3][0] + i * nWords;
    p->ppTruths[4][0] = p->ppTruths[3][0] + 8 * nWords; 
    for ( i = 1; i < 16; i++ )
        p->ppTruths[4][i] = p->ppTruths[4][0] + i * nWords;
    return p;
}